

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

void XNVCTRLSetGvoColorConversion
               (Display *dpy,int screen,float (*colorMatrix) [3],float *colorOffset,
               float *colorScale)

{
  XExtDisplayInfo *pXVar1;
  undefined1 *puVar2;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 *in_R8;
  xnvCtrlSetGvoColorConversionReq *req;
  XExtDisplayInfo *info;
  Display *in_stack_ffffffffffffffc8;
  
  pXVar1 = find_display(in_stack_ffffffffffffffc8);
  if ((pXVar1 == (XExtDisplayInfo *)0x0) || (pXVar1->codes == (XExtCodes *)0x0)) {
    XMissingExtension(in_RDI,nvctrl_extension_name);
  }
  else {
    if (*(long *)(in_RDI + 0x968) != 0) {
      (*(code *)**(undefined8 **)(in_RDI + 0x968))(in_RDI);
    }
    puVar2 = (undefined1 *)_XGetRequest(in_RDI,0x15,0x44);
    *puVar2 = (char)pXVar1->codes->major_opcode;
    puVar2[1] = 0x15;
    *(undefined4 *)(puVar2 + 4) = in_ESI;
    *(undefined4 *)(puVar2 + 8) = *in_RDX;
    *(undefined4 *)(puVar2 + 0xc) = in_RDX[1];
    *(undefined4 *)(puVar2 + 0x10) = in_RDX[2];
    *(undefined4 *)(puVar2 + 0x14) = in_RDX[3];
    *(undefined4 *)(puVar2 + 0x18) = in_RDX[4];
    *(undefined4 *)(puVar2 + 0x1c) = in_RDX[5];
    *(undefined4 *)(puVar2 + 0x20) = in_RDX[6];
    *(undefined4 *)(puVar2 + 0x24) = in_RDX[7];
    *(undefined4 *)(puVar2 + 0x28) = in_RDX[8];
    *(undefined4 *)(puVar2 + 0x2c) = *in_RCX;
    *(undefined4 *)(puVar2 + 0x30) = in_RCX[1];
    *(undefined4 *)(puVar2 + 0x34) = in_RCX[2];
    *(undefined4 *)(puVar2 + 0x38) = *in_R8;
    *(undefined4 *)(puVar2 + 0x3c) = in_R8[1];
    *(undefined4 *)(puVar2 + 0x40) = in_R8[2];
    if (*(long *)(in_RDI + 0x968) != 0) {
      (**(code **)(*(long *)(in_RDI + 0x968) + 8))(in_RDI);
    }
    if (*(long *)(in_RDI + 0xd0) != 0) {
      (**(code **)(in_RDI + 0xd0))(in_RDI);
    }
  }
  return;
}

Assistant:

void XNVCTRLSetGvoColorConversion (
    Display *dpy,
    int screen,
    float colorMatrix[3][3],
    float colorOffset[3],
    float colorScale[3]
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlSetGvoColorConversionReq *req;

    XNVCTRLSimpleCheckExtension (dpy, info);

    LockDisplay (dpy);
    GetReq (nvCtrlSetGvoColorConversion, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlSetGvoColorConversion;
    req->screen = screen;

    req->cscMatrix_y_r = colorMatrix[0][0];
    req->cscMatrix_y_g = colorMatrix[0][1];
    req->cscMatrix_y_b = colorMatrix[0][2];

    req->cscMatrix_cr_r = colorMatrix[1][0];
    req->cscMatrix_cr_g = colorMatrix[1][1];
    req->cscMatrix_cr_b = colorMatrix[1][2];

    req->cscMatrix_cb_r = colorMatrix[2][0];
    req->cscMatrix_cb_g = colorMatrix[2][1];
    req->cscMatrix_cb_b = colorMatrix[2][2];

    req->cscOffset_y  = colorOffset[0];
    req->cscOffset_cr = colorOffset[1];
    req->cscOffset_cb = colorOffset[2];

    req->cscScale_y  = colorScale[0];
    req->cscScale_cr = colorScale[1];
    req->cscScale_cb = colorScale[2];

    UnlockDisplay (dpy);
    SyncHandle ();
}